

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

int Extra_Base2LogDouble(double Num)

{
  double dVar1;
  
  dVar1 = log(Num);
  dVar1 = dVar1 / 0.6931471805599453;
  return (int)dVar1 + (uint)((double)(int)dVar1 != dVar1);
}

Assistant:

int Extra_Base2LogDouble( double Num )
{
    double Res;
    int ResInt;

    Res    = log(Num)/log(2.0);
    ResInt = (int)Res;
    if ( ResInt == Res )
        return ResInt;
    else 
        return ResInt+1;
}